

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

bool __thiscall
chaiscript::dispatch::
Attribute_Access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::exception::eval_error>
::operator==(Attribute_Access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::exception::eval_error>
             *this,Proxy_Function_Base *t_func)

{
  long lVar1;
  bool bVar2;
  
  bVar2 = false;
  lVar1 = __dynamic_cast(t_func,&Proxy_Function_Base::typeinfo,
                         &Attribute_Access<std::__cxx11::string,chaiscript::exception::eval_error>::
                          typeinfo,0);
  if (lVar1 != 0) {
    bVar2 = this->m_attr ==
            *(offset_in_eval_error_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)(lVar1 + 0x28);
  }
  return bVar2;
}

Assistant:

virtual bool operator==(const Proxy_Function_Base &t_func) const CHAISCRIPT_OVERRIDE
        {
          const Attribute_Access<T, Class> * aa 
            = dynamic_cast<const Attribute_Access<T, Class> *>(&t_func);

          if (aa) {
            return m_attr == aa->m_attr;
          } else {
            return false;
          }
        }